

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O0

void upb_Message_ClearBaseField(upb_Message *msg,upb_MiniTableField *f)

{
  uint32_t uVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint32_t *puVar4;
  void *to;
  undefined1 local_38 [8];
  char zeros [16];
  uint32_t *ptr;
  upb_MiniTableField *f_local;
  upb_Message *msg_local;
  
  _Var2 = upb_Message_IsFrozen(msg);
  if (_Var2) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x361,
                  "void upb_Message_ClearBaseField(struct upb_Message *, const upb_MiniTableField *)"
                 );
  }
  _Var2 = _upb_MiniTableField_HasHasbit_dont_copy_me__upb_internal_use_only(f);
  if (_Var2) {
    _upb_Message_ClearHasbit_dont_copy_me__upb_internal_use_only(msg,f);
  }
  else {
    _Var2 = upb_MiniTableField_IsInOneof(f);
    if (_Var2) {
      puVar4 = _upb_Message_OneofCasePtr_dont_copy_me__upb_internal_use_only(msg,f);
      uVar1 = *puVar4;
      uVar3 = upb_MiniTableField_Number(f);
      if (uVar1 != uVar3) {
        return;
      }
      *puVar4 = 0;
    }
  }
  memset(local_38,0,0x10);
  to = _upb_Message_MutableDataPtr_dont_copy_me__upb_internal_use_only(msg,f);
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f,to,local_38);
  return;
}

Assistant:

UPB_API_INLINE void upb_Message_ClearBaseField(struct upb_Message* msg,
                                               const upb_MiniTableField* f) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  if (UPB_PRIVATE(_upb_MiniTableField_HasHasbit)(f)) {
    UPB_PRIVATE(_upb_Message_ClearHasbit)(msg, f);
  } else if (upb_MiniTableField_IsInOneof(f)) {
    uint32_t* ptr = UPB_PRIVATE(_upb_Message_OneofCasePtr)(msg, f);
    if (*ptr != upb_MiniTableField_Number(f)) return;
    *ptr = 0;
  }
  const char zeros[16] = {0};
  UPB_PRIVATE(_upb_MiniTableField_DataCopy)
  (f, UPB_PRIVATE(_upb_Message_MutableDataPtr)(msg, f), zeros);
}